

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateForwardDeclarations
          (FileGenerator *this,Printer *printer)

{
  cpp *pcVar1;
  _Rb_tree_node_base *p_Var2;
  size_type sVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Options *in_RCX;
  Options *pOVar6;
  Options *pOVar7;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  classes;
  NamespaceOpener ns;
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  enums;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  public_set;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  decls;
  Formatter format;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_138;
  string local_118;
  EnumDescriptor **local_f8;
  iterator iStack_f0;
  EnumDescriptor **local_e8;
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  local_98;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  local_138.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Descriptor **)0x0;
  local_138.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (Descriptor **)0x0;
  local_138.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Descriptor **)0x0;
  local_e8 = (EnumDescriptor **)0x0;
  local_f8 = (EnumDescriptor **)0x0;
  iStack_f0._M_current = (EnumDescriptor **)0x0;
  FlattenMessagesInFile(this->file_,&local_138);
  if ((this->options_).proto_h == true) {
    local_d8._M_buckets = (__buckets_ptr)0x0;
    local_d8._M_bucket_count = 0;
    local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ListAllFields(this->file_,
                  (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&local_d8);
    if ((__buckets_ptr)local_d8._M_bucket_count != local_d8._M_buckets) {
      pOVar6 = (Options *)0x0;
      do {
        local_98._M_impl._0_8_ = local_d8._M_buckets[(long)pOVar6][10]._M_nxt;
        if (local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&local_138,
                     (iterator)
                     local_138.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Descriptor **)&local_98);
        }
        else {
          *local_138.
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (Descriptor *)local_98._M_impl._0_8_;
          local_138.
          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_138.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_98._M_impl._0_8_ =
             FieldDescriptor::message_type((FieldDescriptor *)local_d8._M_buckets[(long)pOVar6]);
        if (local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_138.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&local_138,
                     (iterator)
                     local_138.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Descriptor **)&local_98);
        }
        else {
          *local_138.
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (Descriptor *)local_98._M_impl._0_8_;
          local_138.
          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_138.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_98._M_impl._0_8_ =
             FieldDescriptor::enum_type((FieldDescriptor *)local_d8._M_buckets[(long)pOVar6]);
        if (iStack_f0._M_current == local_e8) {
          std::
          vector<google::protobuf::EnumDescriptor_const*,std::allocator<google::protobuf::EnumDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumDescriptor_const*>
                    ((vector<google::protobuf::EnumDescriptor_const*,std::allocator<google::protobuf::EnumDescriptor_const*>>
                      *)&local_f8,iStack_f0,(EnumDescriptor **)&local_98);
        }
        else {
          *iStack_f0._M_current = (EnumDescriptor *)local_98._M_impl._0_8_;
          iStack_f0._M_current = iStack_f0._M_current + 1;
        }
        pOVar6 = (Options *)((long)&(pOVar6->dllexport_decl)._M_dataplus._M_p + 1);
        in_RCX = (Options *)((long)(local_d8._M_bucket_count - (long)local_d8._M_buckets) >> 3);
      } while (pOVar6 < in_RCX);
    }
    ListAllTypesForServices(this->file_,&local_138);
    if (local_d8._M_buckets != (__buckets_ptr)0x0) {
      operator_delete(local_d8._M_buckets);
    }
  }
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  PublicImportDFS(this->file_,
                  (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&local_d8);
  pOVar6 = &this->options_;
  p_Var2 = (_Rb_tree_node_base *)((long)&local_98 + 8);
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  if (local_138.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_138.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pOVar7 = (Options *)0x0;
    do {
      pcVar1 = (cpp *)local_138.
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pOVar7];
      if (pcVar1 != (cpp *)0x0) {
        local_118._M_dataplus._M_p = *(pointer *)(pcVar1 + 0x10);
        sVar3 = std::
                _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&local_d8,(key_type *)&local_118);
        if (sVar3 == 0) {
          Namespace_abi_cxx11_(&local_118,pcVar1,(Descriptor *)pOVar6,in_RCX);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                                 *)&local_98,&local_118);
          ForwardDeclarations::AddMessage(pmVar4,(Descriptor *)pcVar1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
        }
      }
      pOVar7 = (Options *)((long)&(pOVar7->dllexport_decl)._M_dataplus._M_p + 1);
      in_RCX = (Options *)
               ((long)local_138.
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_138.
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
    } while (pOVar7 < in_RCX);
  }
  if (iStack_f0._M_current != local_f8) {
    pOVar7 = (Options *)0x0;
    do {
      pcVar1 = (cpp *)local_f8[(long)pOVar7];
      if (pcVar1 != (cpp *)0x0) {
        local_118._M_dataplus._M_p = *(pointer *)(pcVar1 + 0x10);
        sVar3 = std::
                _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&local_d8,(key_type *)&local_118);
        if (sVar3 == 0) {
          Namespace_abi_cxx11_(&local_118,pcVar1,(EnumDescriptor *)pOVar6,in_RCX);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                                 *)&local_98,&local_118);
          ForwardDeclarations::AddEnum(pmVar4,(EnumDescriptor *)pcVar1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
        }
      }
      pOVar7 = (Options *)((long)&(pOVar7->dllexport_decl)._M_dataplus._M_p + 1);
      in_RCX = (Options *)((long)iStack_f0._M_current - (long)local_f8 >> 3);
    } while (pOVar7 < in_RCX);
  }
  local_118._M_dataplus._M_p = &(local_68.printer_)->variable_delimiter_;
  local_118._M_string_length = 0;
  local_118.field_2._M_allocated_capacity = 0;
  local_118.field_2._8_8_ = 0;
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      NamespaceOpener::ChangeTo((NamespaceOpener *)&local_118,(string *)(p_Var5 + 1));
      ForwardDeclarations::Print((ForwardDeclarations *)(p_Var5 + 2),&local_68,pOVar6);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != p_Var2);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)&local_118);
  Formatter::operator()<>(&local_68,"PROTOBUF_NAMESPACE_OPEN\n");
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      ForwardDeclarations::PrintTopLevelDecl((ForwardDeclarations *)(p_Var5 + 2),&local_68,pOVar6);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != p_Var2);
  }
  Formatter::operator()<>(&local_68,"PROTOBUF_NAMESPACE_CLOSE\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8);
  if (local_f8 != (EnumDescriptor **)0x0) {
    operator_delete(local_f8);
  }
  if (local_138.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Descriptor **)0x0) {
    operator_delete(local_138.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateForwardDeclarations(io::Printer* printer) {
  Formatter format(printer, variables_);
  std::vector<const Descriptor*> classes;
  std::vector<const EnumDescriptor*> enums;

  FlattenMessagesInFile(file_, &classes);  // All messages need forward decls.

  if (options_.proto_h) {  // proto.h needs extra forward declarations.
    // All classes / enums refered to as field members
    std::vector<const FieldDescriptor*> fields;
    ListAllFields(file_, &fields);
    for (int i = 0; i < fields.size(); i++) {
      classes.push_back(fields[i]->containing_type());
      classes.push_back(fields[i]->message_type());
      enums.push_back(fields[i]->enum_type());
    }
    ListAllTypesForServices(file_, &classes);
  }

  // Calculate the set of files whose definitions we get through include.
  // No need to forward declare types that are defined in these.
  std::unordered_set<const FileDescriptor*> public_set;
  PublicImportDFS(file_, &public_set);

  std::map<std::string, ForwardDeclarations> decls;
  for (int i = 0; i < classes.size(); i++) {
    const Descriptor* d = classes[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddMessage(d);
  }
  for (int i = 0; i < enums.size(); i++) {
    const EnumDescriptor* d = enums[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddEnum(d);
  }


  {
    NamespaceOpener ns(format);
    for (const auto& pair : decls) {
      ns.ChangeTo(pair.first);
      pair.second.Print(format, options_);
    }
  }
  format("PROTOBUF_NAMESPACE_OPEN\n");
  for (const auto& pair : decls) {
    pair.second.PrintTopLevelDecl(format, options_);
  }
  format("PROTOBUF_NAMESPACE_CLOSE\n");
}